

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O2

int16_list * ntru_ring_invert_wrapper(int16_list *in,uint p,uint q)

{
  uint uVar1;
  int16_list *piVar2;
  int16_list *piVar3;
  
  int16_list_resize(in,p);
  piVar2 = make_int16_list((ulong)p);
  uVar1 = ntru_ring_invert(piVar2->integers,in->integers,p,q);
  piVar3 = (int16_list *)0x0;
  if (uVar1 != 0) {
    piVar3 = piVar2;
  }
  return piVar3;
}

Assistant:

int16_list *ntru_ring_invert_wrapper(int16_list *in, unsigned p, unsigned q)
{
    int16_list_resize(in, p);
    int16_list *out = make_int16_list(p);
    unsigned success = ntru_ring_invert(out->integers, in->integers, p, q);
    if (!success)
        return NULL;
    return out;
}